

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_887c0::CpuAbsoluteTest::run_readwrite_instruction
          (CpuAbsoluteTest *this,uint8_t instruction,uint8_t new_memory_content)

{
  uint16_t uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar5;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar6;
  MockSpec<void_(unsigned_short,_unsigned_char)> *pMVar7;
  char *message;
  AssertHelper local_270;
  Message local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar;
  Matcher<unsigned_char> local_248;
  Matcher<unsigned_short> local_230;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_218;
  WithoutMatchers local_1d9;
  Matcher<unsigned_char> local_1d8;
  Matcher<unsigned_short> local_1c0;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_1a8;
  ReturnAction<unsigned_char> local_170;
  Action<unsigned_char_(unsigned_short)> local_160;
  WithoutMatchers local_139;
  Matcher<unsigned_short> local_138;
  MockSpec<unsigned_char_(unsigned_short)> local_120;
  ReturnAction<unsigned_char> local_100;
  Action<unsigned_char_(unsigned_short)> local_f0;
  WithoutMatchers local_c9;
  Matcher<unsigned_short> local_c8;
  MockSpec<unsigned_char_(unsigned_short)> local_b0;
  ReturnAction<unsigned_char> local_90;
  Action<unsigned_char_(unsigned_short)> local_80;
  WithoutMatchers local_5d [13];
  Matcher<unsigned_short> local_50;
  MockSpec<unsigned_char_(unsigned_short)> local_38;
  uchar local_14;
  uchar local_13;
  uint8_t local_12;
  uint8_t local_11;
  uint8_t upper_address;
  uint8_t lower_address;
  uint8_t new_memory_content_local;
  CpuAbsoluteTest *pCStack_10;
  uint8_t instruction_local;
  CpuAbsoluteTest *this_local;
  
  uVar1 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar1;
  (this->super_CpuTest).registers.pc = uVar1;
  local_12 = new_memory_content;
  local_11 = instruction;
  pCStack_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  uVar2 = (this->super_CpuTest).expected.pc;
  if (SCARRY4((uint)uVar2,2)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  (this->super_CpuTest).expected.pc = uVar2 + 2;
  local_13 = (uchar)*(undefined2 *)&(this->super_CpuTest).field_0x116;
  local_14 = (uchar)((ushort)*(undefined2 *)&(this->super_CpuTest).field_0x116 >> 8);
  uVar2 = *(ushort *)&(this->super_CpuTest).field_0x112;
  if (!SCARRY4((uint)uVar2,1)) {
    testing::Matcher<unsigned_short>::Matcher(&local_50,uVar2 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_38,&(this->super_CpuTest).mmu.super_MockMmu,&local_50);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_38,local_5d,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                        ,0x43,"mmu","read_byte(start_pc + 1)");
    testing::Return<unsigned_char>((testing *)&local_90,local_13);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_80,(ReturnAction *)&local_90);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_80);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_80);
    testing::internal::ReturnAction<unsigned_char>::~ReturnAction(&local_90);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_38);
    testing::Matcher<unsigned_short>::~Matcher(&local_50);
    uVar2 = *(ushort *)&(this->super_CpuTest).field_0x112;
    if (!SCARRY4((uint)uVar2,2)) {
      testing::Matcher<unsigned_short>::Matcher(&local_c8,uVar2 + 2);
      n_e_s::core::test::MockMmu::gmock_read_byte
                (&local_b0,&(this->super_CpuTest).mmu.super_MockMmu,&local_c8);
      testing::internal::GetWithoutMatchers();
      pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                         (&local_b0,&local_c9,(void *)0x0);
      pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                         (pMVar5,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                          ,0x45,"mmu","read_byte(start_pc + 2)");
      testing::Return<unsigned_char>((testing *)&local_100,local_14);
      testing::internal::ReturnAction::operator_cast_to_Action(&local_f0,(ReturnAction *)&local_100)
      ;
      testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
                (pTVar6,&local_f0);
      testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_f0);
      testing::internal::ReturnAction<unsigned_char>::~ReturnAction(&local_100);
      testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_b0);
      testing::Matcher<unsigned_short>::~Matcher(&local_c8);
      testing::Matcher<unsigned_short>::Matcher
                (&local_138,*(unsigned_short *)&(this->super_CpuTest).field_0x116);
      n_e_s::core::test::MockMmu::gmock_read_byte
                (&local_120,&(this->super_CpuTest).mmu.super_MockMmu,&local_138);
      testing::internal::GetWithoutMatchers();
      pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                         (&local_120,&local_139,(void *)0x0);
      pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                         (pMVar5,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                          ,0x47,"mmu","read_byte(effective_address)");
      testing::Return<unsigned_char>((testing *)&local_170,(this->super_CpuTest).field_0x114);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_160,(ReturnAction *)&local_170);
      testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
                (pTVar6,&local_160);
      testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_160);
      testing::internal::ReturnAction<unsigned_char>::~ReturnAction(&local_170);
      testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_120);
      testing::Matcher<unsigned_short>::~Matcher(&local_138);
      testing::Matcher<unsigned_short>::Matcher
                (&local_1c0,*(unsigned_short *)&(this->super_CpuTest).field_0x116);
      testing::Matcher<unsigned_char>::Matcher(&local_1d8,(this->super_CpuTest).field_0x114);
      n_e_s::core::test::MockMmu::gmock_write_byte
                (&local_1a8,&(this->super_CpuTest).mmu.super_MockMmu,&local_1c0,&local_1d8);
      testing::internal::GetWithoutMatchers();
      pMVar7 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                         (&local_1a8,&local_1d9,(void *)0x0);
      testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
                (pMVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                 ,0x4a,"mmu","write_byte(effective_address, memory_content)");
      testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_1a8);
      testing::Matcher<unsigned_char>::~Matcher(&local_1d8);
      testing::Matcher<unsigned_short>::~Matcher(&local_1c0);
      testing::Matcher<unsigned_short>::Matcher
                (&local_230,*(unsigned_short *)&(this->super_CpuTest).field_0x116);
      testing::Matcher<unsigned_char>::Matcher(&local_248,local_12);
      n_e_s::core::test::MockMmu::gmock_write_byte
                (&local_218,&(this->super_CpuTest).mmu.super_MockMmu,&local_230,&local_248);
      testing::internal::GetWithoutMatchers();
      pMVar7 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                         (&local_218,
                          (WithoutMatchers *)
                          ((long)&gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          + 7),(void *)0x0);
      testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
                (pMVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                 ,0x4b,"mmu","write_byte(effective_address, new_memory_content)");
      testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_218);
      testing::Matcher<unsigned_char>::~Matcher(&local_248);
      testing::Matcher<unsigned_short>::~Matcher(&local_230);
      n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x06');
      testing::internal::EqHelper::
      Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
                ((EqHelper *)local_260,"expected","registers",&(this->super_CpuTest).expected,
                 &(this->super_CpuTest).registers);
      bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
      if (!bVar4) {
        testing::Message::Message(&local_268);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_260);
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                   ,0x4e,message);
        testing::internal::AssertHelper::operator=(&local_270,&local_268);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        testing::Message::~Message(&local_268);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
      return;
    }
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void run_readwrite_instruction(uint8_t instruction,
            uint8_t new_memory_content) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 2;

        const auto lower_address = static_cast<uint8_t>(
                effective_address & static_cast<uint16_t>(0x00FFu));
        const auto upper_address =
                static_cast<uint8_t>((effective_address & 0xFF00u) >> 8u);

        EXPECT_CALL(mmu, read_byte(start_pc + 1))
                .WillOnce(Return(lower_address));
        EXPECT_CALL(mmu, read_byte(start_pc + 2))
                .WillOnce(Return(upper_address));
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));
        // Dummy write
        EXPECT_CALL(mmu, write_byte(effective_address, memory_content));
        EXPECT_CALL(mmu, write_byte(effective_address, new_memory_content));

        step_execution(6);
        EXPECT_EQ(expected, registers);
    }